

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall sznet::net::TcpServer::removeConnection(TcpServer *this,TcpConnectionPtr *conn)

{
  EventLoop *this_00;
  code *local_78;
  undefined8 local_70;
  _Bind<void_(sznet::net::TcpServer::*(sznet::net::TcpServer_*,_std::shared_ptr<sznet::net::TcpConnection>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
  local_68;
  Functor local_40;
  TcpServer *local_20;
  
  this_00 = this->m_loop;
  local_78 = removeConnectionInLoop;
  local_70 = 0;
  local_20 = this;
  std::
  _Bind<void(sznet::net::TcpServer::*(sznet::net::TcpServer*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>
  ::_Bind<sznet::net::TcpServer*,std::shared_ptr<sznet::net::TcpConnection>const&>
            ((_Bind<void(sznet::net::TcpServer::*(sznet::net::TcpServer*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>
              *)&local_68,(offset_in_TcpServer_to_subr *)&local_78,&local_20,conn);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpServer::*(sznet::net::TcpServer*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
            ((function<void()> *)&local_40,&local_68);
  EventLoop::runInLoop(this_00,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_68._M_bound_args.
                     super__Tuple_impl<0UL,_sznet::net::TcpServer_*,_std::shared_ptr<sznet::net::TcpConnection>_>
                     .super__Tuple_impl<1UL,_std::shared_ptr<sznet::net::TcpConnection>_>.
                     super__Head_base<1UL,_std::shared_ptr<sznet::net::TcpConnection>,_false>.
                     _M_head_impl + 8));
  return;
}

Assistant:

void TcpServer::removeConnection(const TcpConnectionPtr& conn)
{
	// FIXME: unsafe
	m_loop->runInLoop(std::bind(&TcpServer::removeConnectionInLoop, this, conn));
}